

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O0

size_t __thiscall HawkTracer::parser::EventKlassField::get_sizeof(EventKlassField *this)

{
  bool bVar1;
  bool bVar2;
  FieldType v;
  EventKlassField *this_local;
  
  bVar1 = is_numeric(this);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = this->_type_id == POINTER;
  }
  if (bVar2) {
    switch(this->_type_id) {
    case UINT8:
      this_local = (EventKlassField *)0x1;
      break;
    case INT8:
      this_local = (EventKlassField *)0x1;
      break;
    case UINT16:
      this_local = (EventKlassField *)0x2;
      break;
    case INT16:
      this_local = (EventKlassField *)0x2;
      break;
    case UINT32:
      this_local = (EventKlassField *)0x4;
      break;
    case INT32:
      this_local = (EventKlassField *)0x4;
      break;
    case UINT64:
      this_local = (EventKlassField *)0x8;
      break;
    case INT64:
      this_local = (EventKlassField *)0x8;
      break;
    case POINTER:
      this_local = (EventKlassField *)0x8;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/event_klass.cpp"
                    ,0x21,"size_t HawkTracer::parser::EventKlassField::get_sizeof() const");
    }
    return (size_t)this_local;
  }
  __assert_fail("is_numeric() || _type_id == FieldTypeId::POINTER",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/event_klass.cpp"
                ,0x13,"size_t HawkTracer::parser::EventKlassField::get_sizeof() const");
}

Assistant:

size_t EventKlassField::get_sizeof() const
{
    assert(is_numeric() || _type_id == FieldTypeId::POINTER);
    FieldType v;
#define GET_SIZE_VARIANT(type_id) case FieldTypeId::type_id: return sizeof(v.f_##type_id)
    switch (_type_id)
    {
    GET_SIZE_VARIANT(INT8);
    GET_SIZE_VARIANT(UINT8);
    GET_SIZE_VARIANT(INT16);
    GET_SIZE_VARIANT(UINT16);
    GET_SIZE_VARIANT(INT32);
    GET_SIZE_VARIANT(UINT32);
    GET_SIZE_VARIANT(INT64);
    GET_SIZE_VARIANT(UINT64);
    GET_SIZE_VARIANT(POINTER);
    default: assert(0); return 0;
    }
#undef GET_SIZE_VARIANT
}